

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var __thiscall cs_impl::runtime_cs_ext::build(runtime_cs_ext *this,context_t *context,string *expr)

{
  char *ch;
  pointer __x;
  size_type sVar1;
  expression_t tree;
  deque<char,_std::allocator<char>_> buff;
  
  std::_Deque_base<char,_std::allocator<char>_>::_Deque_base
            (&buff.super__Deque_base<char,_std::allocator<char>_>);
  tree.mRoot = (tree_node *)0x0;
  __x = (expr->_M_dataplus)._M_p;
  for (sVar1 = expr->_M_string_length; sVar1 != 0; sVar1 = sVar1 - 1) {
    std::deque<char,_std::allocator<char>_>::push_back
              ((deque<char,_std::allocator<char>_> *)
               &buff.super__Deque_base<char,_std::allocator<char>_>,__x);
    __x = __x + 1;
  }
  cs::compiler_type::build_expr
            ((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &buff,&tree,utf8);
  any::make<cs::tree_type<cs::token_base*>,cs::tree_type<cs::token_base*>&>((any *)this,&tree);
  cs::tree_type<cs::token_base_*>::~tree_type(&tree);
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
            (&buff.super__Deque_base<char,_std::allocator<char>_>);
  return (var)(proxy *)this;
}

Assistant:

var build(const context_t &context, const string &expr)
		{
			std::deque<char> buff;
			expression_t tree;
			for (auto &ch: expr)
				buff.push_back(ch);
			context->compiler->build_expr(buff, tree);
			return var::make<expression_t>(tree);
		}